

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

int kwsysSystem__AppendByte(char *local,char **begin,char **end,int *size,char c)

{
  char *__src;
  char *pcVar1;
  size_t __size;
  size_t __n;
  
  pcVar1 = *end;
  __src = *begin;
  __n = (long)pcVar1 - (long)__src;
  if ((long)*size <= (long)__n) {
    __size = (long)*size * 2;
    pcVar1 = (char *)malloc(__size);
    if (pcVar1 == (char *)0x0) {
      return 0;
    }
    memcpy(pcVar1,__src,__n);
    if (__src != local) {
      free(__src);
      __size = (size_t)(uint)(*size * 2);
    }
    *begin = pcVar1;
    pcVar1 = pcVar1 + __n;
    *size = (int)__size;
  }
  *end = pcVar1 + 1;
  *pcVar1 = c;
  return 1;
}

Assistant:

static int kwsysSystem__AppendByte(char* local,
                                   char** begin, char** end,
                                   int* size, char c)
{
  /* Allocate space for the character.  */
  if((*end - *begin) >= *size)
    {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char* newBuffer = (char*)malloc((size_t)(*size*2));
    if(!newBuffer)
      {
      return 0;
      }
    memcpy(newBuffer, *begin, (size_t)(length)*sizeof(char));
    if(*begin != local)
      {
      free(*begin);
      }
    *begin = newBuffer;
    *end = *begin + length;
    *size *= 2;
    }

  /* Store the character.  */
  *(*end)++ = c;
  return 1;
}